

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderRenderingTrianglesCase::GeometryShaderRenderingTrianglesCase
          (GeometryShaderRenderingTrianglesCase *this,Context *context,ExtParameters *extParams,
          char *name,bool use_adjacency_data,GLenum drawcall_mode,_shader_output_type output_type)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  TestError *pTVar5;
  void *pvVar6;
  reference pvVar7;
  float *pfVar8;
  long lVar9;
  int local_190;
  int local_18c;
  int n_1;
  int index_1;
  int index;
  uint n;
  float *raw_array_traveller_ptr;
  int raw_array_indices [24];
  int n_raw_array_indices;
  Vector<float,_4> local_104;
  Vector<float,_4> local_f4;
  Vector<float,_4> local_e4;
  Vector<float,_4> local_d4;
  float local_c4;
  float local_c0;
  float start_y;
  float mid_y;
  float end_y;
  float dy_multiplier;
  float dx_multiplier;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_coordinates;
  uint whole_rt_height;
  uint whole_rt_width;
  uint single_rt_width;
  uint single_rt_height;
  float dy;
  float dx;
  uint *unordered_elements_data_size_ptr;
  uchar **unordered_elements_data_ptr;
  uint *unordered_arrays_data_size_ptr;
  float **unordered_arrays_data_ptr;
  uint rendertarget_width;
  uint rendertarget_height;
  uint *raw_arrays_data_size_ptr;
  float **raw_arrays_data_ptr;
  int n_instances;
  bool is_instanced;
  int n_case;
  GLenum local_30;
  byte local_29;
  GLenum drawcall_mode_local;
  bool use_adjacency_data_local;
  char *name_local;
  ExtParameters *extParams_local;
  Context *context_local;
  GeometryShaderRenderingTrianglesCase *this_local;
  
  local_30 = drawcall_mode;
  local_29 = use_adjacency_data;
  _drawcall_mode_local = name;
  name_local = (char *)extParams;
  extParams_local = (ExtParameters *)context;
  context_local = (Context *)this;
  GeometryShaderRenderingCase::GeometryShaderRenderingCase
            (&this->super_GeometryShaderRenderingCase,context,extParams,name,
             "Verifies all draw calls work correctly for specific input+output+draw call mode combination"
            );
  (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderingTrianglesCase_03260bd0;
  *(_shader_output_type *)&(this->super_GeometryShaderRenderingCase).field_0x304 = output_type;
  this->m_drawcall_mode = local_30;
  this->m_use_adjacency_data = (bool)(local_29 & 1);
  this->m_raw_array_instanced_data = (float *)0x0;
  this->m_raw_array_instanced_data_size = 0;
  this->m_raw_array_noninstanced_data = (float *)0x0;
  this->m_raw_array_noninstanced_data_size = 0;
  this->m_unordered_array_instanced_data = (float *)0x0;
  this->m_unordered_array_instanced_data_size = 0;
  this->m_unordered_array_noninstanced_data = (float *)0x0;
  this->m_unordered_array_noninstanced_data_size = 0;
  this->m_unordered_elements_instanced_data = (uchar *)0x0;
  this->m_unordered_elements_instanced_data_size = 0;
  this->m_unordered_elements_noninstanced_data = (uchar *)0x0;
  this->m_unordered_elements_noninstanced_data_size = 0;
  this->m_unordered_elements_max_index = '\x18';
  this->m_unordered_elements_min_index = '\0';
  if ((this->m_use_adjacency_data & 1U) == 0) {
    if (((local_30 != 4) && (local_30 != 5)) && (local_30 != 6)) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,
                 "Only GL_TRIANGLES or GL_TRIANGLE_STRIP or GL_TRIANGLE_FAN draw call modes are supported for \'triangles\' geometry shader input layout qualifier test implementation"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xeeb);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  else if ((local_30 != 0xc) && (local_30 != 0xd)) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,
               "Only GL_TRIANGLES_ADJACENCY_EXT or GL_TRIANGLE_STRIP_ADJACENCY_EXT draw call modes are supported for \'triangles_adjacency\' geometry shader input layout qualifier test implementation"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0xef3);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (((output_type != SHADER_OUTPUT_TYPE_POINTS) && (output_type != SHADER_OUTPUT_TYPE_LINE_STRIP))
     && (output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP)) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,
               "Unsupported output layout qualifier type requested for \'triangles\' geometry shader input layout qualifier test implementation"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0xefb);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  for (n_instances = 0; n_instances < 2; n_instances = n_instances + 1) {
    raw_arrays_data_ptr._7_1_ = n_instances != 0;
    raw_arrays_data_ptr._0_4_ = 0;
    raw_arrays_data_size_ptr = (uint *)0x0;
    _rendertarget_width = (uint *)0x0;
    unordered_arrays_data_ptr._4_4_ = 0;
    unordered_arrays_data_ptr._0_4_ = 0;
    unordered_arrays_data_size_ptr = (uint *)0x0;
    unordered_elements_data_ptr = (uchar **)0x0;
    unordered_elements_data_size_ptr = (uint *)0x0;
    _dy = (uint *)0x0;
    if ((bool)raw_arrays_data_ptr._7_1_) {
      raw_arrays_data_ptr._0_4_ =
           (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
             super_TestNode._vptr_TestNode[5])();
      raw_arrays_data_size_ptr = (uint *)&this->m_raw_array_instanced_data;
      _rendertarget_width = &this->m_raw_array_instanced_data_size;
      unordered_arrays_data_size_ptr = (uint *)&this->m_unordered_array_instanced_data;
      unordered_elements_data_ptr = (uchar **)&this->m_unordered_array_instanced_data_size;
      unordered_elements_data_size_ptr = (uint *)&this->m_unordered_elements_instanced_data;
      _dy = &this->m_unordered_elements_instanced_data_size;
    }
    else {
      raw_arrays_data_ptr._0_4_ = 1;
      raw_arrays_data_size_ptr = (uint *)&this->m_raw_array_noninstanced_data;
      _rendertarget_width = &this->m_raw_array_noninstanced_data_size;
      unordered_arrays_data_size_ptr = (uint *)&this->m_unordered_array_noninstanced_data;
      unordered_elements_data_ptr = (uchar **)&this->m_unordered_array_noninstanced_data_size;
      unordered_elements_data_size_ptr = (uint *)&this->m_unordered_elements_noninstanced_data;
      _dy = &this->m_unordered_elements_noninstanced_data_size;
    }
    (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
      _vptr_TestNode[0xd])
              (this,(ulong)(uint)raw_arrays_data_ptr,&unordered_arrays_data_ptr,
               (long)&unordered_arrays_data_ptr + 4);
    single_rt_height = (uint)(2.0 / (float)(uint)unordered_arrays_data_ptr);
    single_rt_width = (uint)(2.0 / (float)unordered_arrays_data_ptr._4_4_);
    whole_rt_width = 0;
    whole_rt_height = 0;
    data_coordinates.
    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    data_coordinates.
    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    iVar3 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
              super_TestNode._vptr_TestNode[7])();
    *_rendertarget_width = iVar3 << 4;
    pvVar6 = operator_new__((ulong)(*_rendertarget_width & 0xfffffffc));
    *(void **)raw_arrays_data_size_ptr = pvVar6;
    (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
      _vptr_TestNode[0xd])(this,1,&whole_rt_height,&whole_rt_width);
    uVar4 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
              super_TestNode._vptr_TestNode[5])();
    (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
      _vptr_TestNode[0xd])
              (this,(ulong)uVar4,
               (undefined1 *)
               ((long)&data_coordinates.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
               &data_coordinates.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &dy_multiplier);
    end_y = 0.0;
    mid_y = 0.0;
    if ((raw_arrays_data_ptr._7_1_ & 1) == 0) {
      start_y = 1.0;
      local_c0 = 0.0;
    }
    else {
      start_y = (float)whole_rt_width /
                (float)(uint)data_coordinates.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage +
                (float)whole_rt_width /
                (float)(uint)data_coordinates.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + -1.0;
      local_c0 = (start_y - -1.0) * 0.5 + -1.0;
    }
    local_c4 = -1.0;
    if (output_type == SHADER_OUTPUT_TYPE_POINTS) {
      end_y = 1.5;
      mid_y = 1.5;
    }
    else if (output_type == SHADER_OUTPUT_TYPE_LINE_STRIP) {
      end_y = 1.5;
      mid_y = 1.5;
    }
    tcu::Vector<float,_4>::Vector(&local_d4,0.0,local_c0,0.0,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &dy_multiplier,&local_d4);
    tcu::Vector<float,_4>::Vector(&local_e4,(float)single_rt_height * end_y + -1.0,local_c0,0.0,0.0)
    ;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &dy_multiplier,&local_e4);
    tcu::Vector<float,_4>::Vector(&local_f4,0.0,(float)single_rt_width * mid_y + local_c4,0.0,0.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &dy_multiplier,&local_f4);
    tcu::Vector<float,_4>::Vector(&local_104,1.0 - (float)single_rt_height * end_y,local_c0,0.0,0.0)
    ;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &dy_multiplier,&local_104);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(raw_array_indices + 0x17),0.0,
               start_y - (float)single_rt_width * mid_y,0.0,0.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &dy_multiplier,(value_type *)(raw_array_indices + 0x17));
    raw_array_indices[0x16] = 0;
    memset(&raw_array_traveller_ptr,0,0x60);
    raw_array_traveller_ptr._0_4_ = 0xffffffff;
    _index = *(float **)raw_arrays_data_size_ptr;
    for (index_1 = 0; (uint)index_1 < 0x18; index_1 = index_1 + 1) {
      raw_array_indices[(ulong)(uint)index_1 - 2] = -1;
    }
    switch(this->m_drawcall_mode) {
    case 4:
      raw_array_traveller_ptr._0_4_ = 0;
      raw_array_traveller_ptr._4_4_ = 1;
      raw_array_indices[0] = 2;
      raw_array_indices[1] = 0;
      raw_array_indices[2] = 2;
      raw_array_indices[3] = 3;
      raw_array_indices[4] = 0;
      raw_array_indices[5] = 3;
      raw_array_indices[6] = 4;
      raw_array_indices[7] = 0;
      raw_array_indices[8] = 4;
      raw_array_indices[9] = 1;
      raw_array_indices[0x16] = 0xc;
      break;
    case 5:
      raw_array_traveller_ptr._0_4_ = 1;
      raw_array_traveller_ptr._4_4_ = 0;
      raw_array_indices[0] = 2;
      raw_array_indices[1] = 3;
      raw_array_indices[2] = 0;
      raw_array_indices[3] = 4;
      raw_array_indices[4] = 1;
      raw_array_indices[0x16] = 7;
      break;
    case 6:
      raw_array_traveller_ptr._0_4_ = 0;
      raw_array_traveller_ptr._4_4_ = 1;
      raw_array_indices[0] = 2;
      raw_array_indices[1] = 3;
      raw_array_indices[2] = 4;
      raw_array_indices[3] = 1;
      raw_array_indices[0x16] = 6;
      break;
    default:
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Unsupported draw call mode",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xff2);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    case 0xc:
      raw_array_traveller_ptr._0_4_ = 0;
      raw_array_traveller_ptr._4_4_ = 0;
      raw_array_indices[0] = 1;
      raw_array_indices[1] = 0;
      raw_array_indices[2] = 2;
      raw_array_indices[3] = 0;
      raw_array_indices[4] = 0;
      raw_array_indices[5] = 0;
      raw_array_indices[6] = 2;
      raw_array_indices[7] = 0;
      raw_array_indices[8] = 3;
      raw_array_indices[9] = 0;
      raw_array_indices[10] = 0;
      raw_array_indices[0xb] = 0;
      raw_array_indices[0xc] = 3;
      raw_array_indices[0xd] = 0;
      raw_array_indices[0xe] = 4;
      raw_array_indices[0xf] = 0;
      raw_array_indices[0x10] = 0;
      raw_array_indices[0x11] = 0;
      raw_array_indices[0x12] = 4;
      raw_array_indices[0x13] = 0;
      raw_array_indices[0x14] = 1;
      raw_array_indices[0x15] = 0;
      raw_array_indices[0x16] = 0x18;
      break;
    case 0xd:
      raw_array_traveller_ptr._0_4_ = 1;
      raw_array_traveller_ptr._4_4_ = 0;
      raw_array_indices[0] = 0;
      raw_array_indices[1] = 0;
      raw_array_indices[2] = 2;
      raw_array_indices[3] = 0;
      raw_array_indices[4] = 3;
      raw_array_indices[5] = 0;
      raw_array_indices[6] = 0;
      raw_array_indices[7] = 0;
      raw_array_indices[8] = 4;
      raw_array_indices[9] = 0;
      raw_array_indices[10] = 1;
      raw_array_indices[0xb] = 0;
      raw_array_indices[0x16] = 0xe;
    }
    for (n_1 = 0; n_1 < raw_array_indices[0x16]; n_1 = n_1 + 1) {
      if (raw_array_indices[(long)n_1 + -2] != -1) {
        pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&dy_multiplier,(long)raw_array_indices[(long)n_1 + -2]);
        pfVar8 = tcu::Vector<float,_4>::x(pvVar7);
        *_index = *pfVar8;
        pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&dy_multiplier,(long)raw_array_indices[(long)n_1 + -2]);
        pfVar8 = tcu::Vector<float,_4>::y(pvVar7);
        _index[1] = *pfVar8;
        pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&dy_multiplier,(long)raw_array_indices[(long)n_1 + -2]);
        pfVar8 = tcu::Vector<float,_4>::z(pvVar7);
        _index[2] = *pfVar8;
        pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&dy_multiplier,(long)raw_array_indices[(long)n_1 + -2]);
        pfVar8 = tcu::Vector<float,_4>::w(pvVar7);
        _index[3] = *pfVar8;
        _index = _index + 4;
      }
    }
    *(uint *)unordered_elements_data_ptr = *_rendertarget_width;
    pvVar6 = operator_new__((ulong)*(uint *)unordered_elements_data_ptr << 2);
    *(void **)unordered_arrays_data_size_ptr = pvVar6;
    *_dy = raw_array_indices[0x16];
    pvVar6 = operator_new__((ulong)*_dy);
    *(void **)unordered_elements_data_size_ptr = pvVar6;
    for (local_18c = 0; local_18c < raw_array_indices[0x16]; local_18c = local_18c + 1) {
      lVar1 = *(long *)unordered_arrays_data_size_ptr;
      lVar9 = (long)(((raw_array_indices[0x16] + -1) - local_18c) * 4);
      lVar2 = *(long *)raw_arrays_data_size_ptr;
      *(undefined8 *)(lVar1 + lVar9 * 4) = *(undefined8 *)(lVar2 + (long)(local_18c << 2) * 4);
      *(undefined8 *)(lVar1 + 8 + lVar9 * 4) =
           *(undefined8 *)(lVar2 + 8 + (long)(local_18c << 2) * 4);
    }
    for (local_190 = 0; local_190 < raw_array_indices[0x16]; local_190 = local_190 + 1) {
      *(char *)(*(long *)unordered_elements_data_size_ptr + (long)local_190) =
           ((char)raw_array_indices[0x16] + -1) - (char)local_190;
    }
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &dy_multiplier);
  }
  return;
}

Assistant:

GeometryShaderRenderingTrianglesCase::GeometryShaderRenderingTrianglesCase(Context&				context,
																		   const ExtParameters& extParams,
																		   const char* name, bool use_adjacency_data,
																		   glw::GLenum		   drawcall_mode,
																		   _shader_output_type output_type)
	: GeometryShaderRenderingCase(
		  context, extParams, name,
		  "Verifies all draw calls work correctly for specific input+output+draw call mode combination")
	, m_output_type(output_type)
	, m_drawcall_mode(drawcall_mode)
	, m_use_adjacency_data(use_adjacency_data)
	, m_raw_array_instanced_data(0)
	, m_raw_array_instanced_data_size(0)
	, m_raw_array_noninstanced_data(0)
	, m_raw_array_noninstanced_data_size(0)
	, m_unordered_array_instanced_data(0)
	, m_unordered_array_instanced_data_size(0)
	, m_unordered_array_noninstanced_data(0)
	, m_unordered_array_noninstanced_data_size(0)
	, m_unordered_elements_instanced_data(0)
	, m_unordered_elements_instanced_data_size(0)
	, m_unordered_elements_noninstanced_data(0)
	, m_unordered_elements_noninstanced_data_size(0)
	, m_unordered_elements_max_index(24) /* maximum amount of vertices generated by this test case */
	, m_unordered_elements_min_index(0)
{
	/* Sanity checks */
	if (!m_use_adjacency_data)
	{
		if (drawcall_mode != GL_TRIANGLES && drawcall_mode != GL_TRIANGLE_STRIP && drawcall_mode != GL_TRIANGLE_FAN)
		{
			TCU_FAIL("Only GL_TRIANGLES or GL_TRIANGLE_STRIP or GL_TRIANGLE_FAN draw call modes are supported for "
					 "'triangles' geometry shader input layout qualifier test implementation");
		}
	}
	else
	{
		if (drawcall_mode != GL_TRIANGLES_ADJACENCY_EXT && drawcall_mode != GL_TRIANGLE_STRIP_ADJACENCY_EXT)
		{
			TCU_FAIL("Only GL_TRIANGLES_ADJACENCY_EXT or GL_TRIANGLE_STRIP_ADJACENCY_EXT draw call modes are supported "
					 "for 'triangles_adjacency' geometry shader input layout qualifier test implementation");
		}
	}

	if (output_type != SHADER_OUTPUT_TYPE_POINTS && output_type != SHADER_OUTPUT_TYPE_LINE_STRIP &&
		output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP)
	{
		TCU_FAIL("Unsupported output layout qualifier type requested for 'triangles' geometry shader input layout "
				 "qualifier test implementation");
	}

	/* Generate data in two flavors - one for non-instanced case, the other one for instanced case */
	for (int n_case = 0; n_case < 2 /* cases */; ++n_case)
	{
		bool			is_instanced					 = (n_case != 0);
		int				n_instances						 = 0;
		float**			raw_arrays_data_ptr				 = NULL;
		unsigned int*   raw_arrays_data_size_ptr		 = NULL;
		unsigned int	rendertarget_height				 = 0;
		unsigned int	rendertarget_width				 = 0;
		float**			unordered_arrays_data_ptr		 = NULL;
		unsigned int*   unordered_arrays_data_size_ptr   = NULL;
		unsigned char** unordered_elements_data_ptr		 = NULL;
		unsigned int*   unordered_elements_data_size_ptr = NULL;

		if (!is_instanced)
		{
			/* Non-instanced case */
			n_instances						 = 1;
			raw_arrays_data_ptr				 = &m_raw_array_noninstanced_data;
			raw_arrays_data_size_ptr		 = &m_raw_array_noninstanced_data_size;
			unordered_arrays_data_ptr		 = &m_unordered_array_noninstanced_data;
			unordered_arrays_data_size_ptr   = &m_unordered_array_noninstanced_data_size;
			unordered_elements_data_ptr		 = &m_unordered_elements_noninstanced_data;
			unordered_elements_data_size_ptr = &m_unordered_elements_noninstanced_data_size;
		}
		else
		{
			/* Instanced case */
			n_instances						 = getAmountOfDrawInstances();
			raw_arrays_data_ptr				 = &m_raw_array_instanced_data;
			raw_arrays_data_size_ptr		 = &m_raw_array_instanced_data_size;
			unordered_arrays_data_ptr		 = &m_unordered_array_instanced_data;
			unordered_arrays_data_size_ptr   = &m_unordered_array_instanced_data_size;
			unordered_elements_data_ptr		 = &m_unordered_elements_instanced_data;
			unordered_elements_data_size_ptr = &m_unordered_elements_instanced_data_size;
		}

		getRenderTargetSize(n_instances, &rendertarget_width, &rendertarget_height);

		/* Store full-screen quad coordinates that will be used for actual array data generation. */
		float dx = 2.0f / float(rendertarget_width);
		float dy = 2.0f / float(rendertarget_height);

		/* Generate raw vertex array data */
		unsigned int single_rt_height = 0;
		unsigned int single_rt_width  = 0;
		unsigned int whole_rt_width   = 0;
		unsigned int whole_rt_height  = 0;

		*raw_arrays_data_size_ptr =
			static_cast<unsigned int>(getAmountOfVerticesPerInstance() * 4 /* components */ * sizeof(float));
		*raw_arrays_data_ptr = new float[*raw_arrays_data_size_ptr / sizeof(float)];

		getRenderTargetSize(1, &single_rt_width, &single_rt_height);
		getRenderTargetSize(getAmountOfDrawInstances(), &whole_rt_width, &whole_rt_height);

		/* Generate the general coordinates storage first.
		 *
		 * For non-instanced draw calls, we only need to draw a single instance, hence we are free
		 * to use screen-space coordinates.
		 * For instanced draw calls, we'll have the vertex shader add gl_InstanceID-specific deltas
		 * to make sure the vertices are laid out correctly, so map <-1, 1> range to <0, screen_space_height_of_single_instance>
		 */
		std::vector<tcu::Vec4> data_coordinates;
		float				   dx_multiplier = 0.0f;
		float				   dy_multiplier = 0.0f;
		float				   end_y		 = 0.0f;
		float				   mid_y		 = 0.0f;
		float				   start_y		 = 0.0f;

		if (is_instanced)
		{
			start_y = -1.0f;
			end_y   = start_y + float(single_rt_height) / float(whole_rt_height) * 2.0f;
			mid_y   = start_y + (end_y - start_y) * 0.5f;
		}
		else
		{
			end_y   = 1.0f;
			mid_y   = 0.0f;
			start_y = -1.0f;
		}

		if (output_type == SHADER_OUTPUT_TYPE_POINTS)
		{
			dx_multiplier = 1.5f;
			dy_multiplier = 1.5f;
		}
		else if (output_type == SHADER_OUTPUT_TYPE_LINE_STRIP)
		{
			dx_multiplier = 1.5f;
			dy_multiplier = 1.5f;
		}

		/* W stores information whether given vertex is the middle vertex */
		data_coordinates.push_back(tcu::Vec4(0, mid_y, 0, 1));						  /* Middle vertex */
		data_coordinates.push_back(tcu::Vec4(-1 + dx * dx_multiplier, mid_y, 0, 0));  /* Left vertex */
		data_coordinates.push_back(tcu::Vec4(0, start_y + dy * dy_multiplier, 0, 0)); /* Top vertex */
		data_coordinates.push_back(tcu::Vec4(1 - dx * dx_multiplier, mid_y, 0, 0));   /* Right vertex */
		data_coordinates.push_back(tcu::Vec4(0, end_y - dy * dy_multiplier, 0, 0));   /* Bottom vertex */

		/* Now that we have the general storage ready, we can generate raw array data for specific draw
		 * call that this specific test instance will be verifying */
		int	n_raw_array_indices	 = 0;
		int	raw_array_indices[24]   = { -1 }; /* 12 is a max for all supported input geometry */
		float* raw_array_traveller_ptr = *raw_arrays_data_ptr;

		for (unsigned int n = 0; n < sizeof(raw_array_indices) / sizeof(raw_array_indices[0]); ++n)
		{
			raw_array_indices[n] = -1;
		}

		switch (m_drawcall_mode)
		{
		case GL_TRIANGLES:
		{
			/* ABC triangle */
			raw_array_indices[0] = 0;
			raw_array_indices[1] = 1;
			raw_array_indices[2] = 2;

			/* ACD triangle */
			raw_array_indices[3] = 0;
			raw_array_indices[4] = 2;
			raw_array_indices[5] = 3;

			/* ADE triangle */
			raw_array_indices[6] = 0;
			raw_array_indices[7] = 3;
			raw_array_indices[8] = 4;

			/* AEB triangle */
			raw_array_indices[9]  = 0;
			raw_array_indices[10] = 4;
			raw_array_indices[11] = 1;

			n_raw_array_indices = 12;

			break;
		} /* case GL_TRIANGLES: */

		case GL_TRIANGLES_ADJACENCY_EXT:
		{
			/* Note: Geometry shader used by this test does not rely on adjacency data
			 *       so we will fill corresponding indices with meaningless information
			 *       (always first vertex data) */
			/* ABC triangle */
			raw_array_indices[0] = 0;
			raw_array_indices[1] = 0;
			raw_array_indices[2] = 1;
			raw_array_indices[3] = 0;
			raw_array_indices[4] = 2;
			raw_array_indices[5] = 0;

			/* ACD triangle */
			raw_array_indices[6]  = 0;
			raw_array_indices[7]  = 0;
			raw_array_indices[8]  = 2;
			raw_array_indices[9]  = 0;
			raw_array_indices[10] = 3;
			raw_array_indices[11] = 0;

			/* ADE triangle */
			raw_array_indices[12] = 0;
			raw_array_indices[13] = 0;
			raw_array_indices[14] = 3;
			raw_array_indices[15] = 0;
			raw_array_indices[16] = 4;
			raw_array_indices[17] = 0;

			/* AEB triangle */
			raw_array_indices[18] = 0;
			raw_array_indices[19] = 0;
			raw_array_indices[20] = 4;
			raw_array_indices[21] = 0;
			raw_array_indices[22] = 1;
			raw_array_indices[23] = 0;

			n_raw_array_indices = 24;

			break;
		} /* case GL_TRIANGLES_ADJACENCY_EXT:*/

		case GL_TRIANGLE_FAN:
		{
			/* ABCDEB */
			raw_array_indices[0] = 0;
			raw_array_indices[1] = 1;
			raw_array_indices[2] = 2;
			raw_array_indices[3] = 3;
			raw_array_indices[4] = 4;
			raw_array_indices[5] = 1;

			n_raw_array_indices = 6;

			break;
		} /* case GL_TRIANGLE_FAN: */

		case GL_TRIANGLE_STRIP:
		{
			/* BACDAEB.
			 *
			 * Note that this will generate a degenerate triangle (ACD & CDA) but that's fine
			 * since we only sample triangle centroids in this test.
			 */
			raw_array_indices[0] = 1;
			raw_array_indices[1] = 0;
			raw_array_indices[2] = 2;
			raw_array_indices[3] = 3;
			raw_array_indices[4] = 0;
			raw_array_indices[5] = 4;
			raw_array_indices[6] = 1;

			n_raw_array_indices = 7;

			break;
		} /* case GL_TRIANGLE_STRIP: */

		case GL_TRIANGLE_STRIP_ADJACENCY_EXT:
		{
			/* Order as in GL_TRIANGLE_STRIP case. Adjacency data not needed for the test,
			 * hence any data can be used.
			 */
			raw_array_indices[0]  = 1;
			raw_array_indices[1]  = 0;
			raw_array_indices[2]  = 0;
			raw_array_indices[3]  = 0;
			raw_array_indices[4]  = 2;
			raw_array_indices[5]  = 0;
			raw_array_indices[6]  = 3;
			raw_array_indices[7]  = 0;
			raw_array_indices[8]  = 0;
			raw_array_indices[9]  = 0;
			raw_array_indices[10] = 4;
			raw_array_indices[11] = 0;
			raw_array_indices[12] = 1;
			raw_array_indices[13] = 0;

			n_raw_array_indices = 14;
			break;
		} /* case GL_TRIANGLE_STRIP_ADJACENCY_EXT: */

		default:
		{
			TCU_FAIL("Unsupported draw call mode");
		}
		} /* switch (m_drawcall_mode) */

		for (int index = 0; index < n_raw_array_indices; ++index)
		{
			if (raw_array_indices[index] != -1)
			{
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].x();
				raw_array_traveller_ptr++;
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].y();
				raw_array_traveller_ptr++;
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].z();
				raw_array_traveller_ptr++;
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].w();
				raw_array_traveller_ptr++;
			}
		}

		/* Generate unordered data:
		 *
		 * Store vertices in reversed order and configure indices so that the pipeline receives
		 * vertex data in original order */
		*unordered_arrays_data_size_ptr   = *raw_arrays_data_size_ptr;
		*unordered_arrays_data_ptr		  = new float[*unordered_arrays_data_size_ptr];
		*unordered_elements_data_size_ptr = static_cast<unsigned int>(n_raw_array_indices * sizeof(unsigned char));
		*unordered_elements_data_ptr	  = new unsigned char[*unordered_elements_data_size_ptr];

		/* Set unordered array data first */
		for (int index = 0; index < n_raw_array_indices; ++index)
		{
			memcpy(*unordered_arrays_data_ptr + 4 /* components */ * (n_raw_array_indices - 1 - index),
				   *raw_arrays_data_ptr + 4 /* components */ * index, sizeof(float) * 4 /* components */);
		}

		/* Followed by index data */
		for (int n = 0; n < n_raw_array_indices; ++n)
		{
			(*unordered_elements_data_ptr)[n] = (unsigned char)(n_raw_array_indices - 1 - n);
		}
	} /* for (both cases) */
}